

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall sznet::net::Socket::setReusePort(Socket *this,bool on)

{
  int iVar1;
  undefined7 in_register_00000031;
  SourceFile file;
  Logger local_fe8;
  undefined4 local_14 [2];
  int optval;
  
  local_14[0] = (undefined4)CONCAT71(in_register_00000031,on);
  iVar1 = setsockopt(this->m_sockfd,1,0xf,local_14,4);
  if (iVar1 < 0 && on) {
    file._8_8_ = 10;
    file.m_data = "Socket.cpp";
    Logger::Logger(&local_fe8,file,0x47,false);
    if (0x14 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"SO_REUSEPORT failed.",0x14);
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x14;
    }
    Logger::~Logger(&local_fe8);
  }
  return;
}

Assistant:

void Socket::setReusePort(bool on)
{
#ifdef SO_REUSEPORT
	int optval = on ? 1 : 0;
	int ret = ::setsockopt(m_sockfd, SOL_SOCKET, SO_REUSEPORT, &optval, static_cast<socklen_t>(sizeof optval));
	if (ret < 0 && on)
	{
		LOG_SYSERR << "SO_REUSEPORT failed.";
	}
#else
	if (on)
	{
		LOG_ERROR << "SO_REUSEPORT is not supported.";
	}
#endif
}